

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckScriptKeyboardAccessible(TidyDocImpl *doc,Node *node)

{
  TidyAttrId TVar1;
  Node *node_00;
  AttVal *pAVar2;
  Node **ppNVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    pAVar2 = (AttVal *)&node->attributes;
    iVar6 = 0;
    iVar7 = 0;
    iVar8 = 0;
    iVar9 = 0;
    iVar5 = 0;
    iVar4 = 0;
    while (pAVar2 = pAVar2->next, pAVar2 != (AttVal *)0x0) {
      if (pAVar2->dict != (Attribute *)0x0) {
        TVar1 = pAVar2->dict->id;
        iVar5 = iVar5 + (uint)(TVar1 == TidyAttr_OnMOUSEOVER);
        iVar4 = iVar4 + (uint)(TVar1 == TidyAttr_OnMOUSEMOVE);
        iVar6 = iVar6 + (uint)(TVar1 == TidyAttr_OnMOUSEDOWN) + (uint)(TVar1 == TidyAttr_OnKEYDOWN);
        iVar7 = iVar7 + (uint)(TVar1 == TidyAttr_OnMOUSEUP) + (uint)(TVar1 == TidyAttr_OnKEYUP);
        iVar8 = iVar8 + (uint)(TVar1 == TidyAttr_OnCLICK) + (uint)(TVar1 == TidyAttr_OnKEYPRESS);
        iVar9 = iVar9 + (uint)(TVar1 == TidyAttr_OnMOUSEOUT) + (uint)(TVar1 == TidyAttr_OnBLUR);
      }
    }
    if (iVar6 == 1) {
      prvTidyReportAccessError(doc,node,0x2ed);
    }
    if (iVar7 == 1) {
      prvTidyReportAccessError(doc,node,0x2ee);
    }
    if (iVar8 == 1) {
      prvTidyReportAccessError(doc,node,0x2ef);
    }
    if (iVar9 == 1) {
      prvTidyReportAccessError(doc,node,0x2f1);
    }
    if (iVar5 == 1) {
      prvTidyReportAccessError(doc,node,0x2f0);
    }
    if (iVar4 == 1) {
      prvTidyReportAccessError(doc,node,0x2f2);
    }
    ppNVar3 = &node->content;
    while (node_00 = *ppNVar3, node_00 != (Node *)0x0) {
      CheckScriptKeyboardAccessible(doc,node_00);
      ppNVar3 = &node_00->next;
    }
  }
  return;
}

Assistant:

static void CheckScriptKeyboardAccessible( TidyDocImpl* doc, Node* node )
{
    Node* content;
    int HasOnMouseDown = 0;
    int HasOnMouseUp = 0;
    int HasOnClick = 0;
    int HasOnMouseOut = 0;
    int HasOnMouseOver = 0;
    int HasOnMouseMove = 0;

    if (Level2_Enabled( doc ))
    {
        AttVal* av;
        /* Checks all elements for their attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Must also have 'ONKEYDOWN' attribute with 'ONMOUSEDOWN' */
            if ( attrIsOnMOUSEDOWN(av) )
                HasOnMouseDown++;

            /* Must also have 'ONKEYUP' attribute with 'ONMOUSEUP' */
            if ( attrIsOnMOUSEUP(av) )
                HasOnMouseUp++;

            /* Must also have 'ONKEYPRESS' attribute with 'ONCLICK' */
            if ( attrIsOnCLICK(av) )
                HasOnClick++;

            /* Must also have 'ONBLUR' attribute with 'ONMOUSEOUT' */
            if ( attrIsOnMOUSEOUT(av) )
                HasOnMouseOut++;

            if ( attrIsOnMOUSEOVER(av) )
                HasOnMouseOver++;

            if ( attrIsOnMOUSEMOVE(av) )
                HasOnMouseMove++;

            if ( attrIsOnKEYDOWN(av) )
                HasOnMouseDown++;

            if ( attrIsOnKEYUP(av) )
                HasOnMouseUp++;

            if ( attrIsOnKEYPRESS(av) )
                HasOnClick++;

            if ( attrIsOnBLUR(av) )
                HasOnMouseOut++;
        }

        if ( HasOnMouseDown == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_DOWN);

        if ( HasOnMouseUp == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_UP);

        if ( HasOnClick == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_CLICK);
        if ( HasOnMouseOut == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OUT);

        if ( HasOnMouseOver == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OVER);

        if ( HasOnMouseMove == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_MOVE);

        /* Recursively check all child nodes.
         */
        for ( content = node->content; content != NULL; content = content->next )
            CheckScriptKeyboardAccessible( doc, content );
    }
}